

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# environment_nav2Duu.cpp
# Opt level: O3

int __thiscall
EnvironmentNAV2DUU::GetFromToHeuristic(EnvironmentNAV2DUU *this,int FromStateID,int ToStateID)

{
  SBPL_Exception *this_00;
  undefined4 in_register_00000014;
  undefined4 in_register_00000034;
  
  this_00 = (SBPL_Exception *)
            __cxa_allocate_exception
                      (0x10,CONCAT44(in_register_00000034,FromStateID),
                       CONCAT44(in_register_00000014,ToStateID));
  SBPL_Exception::SBPL_Exception
            (this_00,"ERROR in EnvNAV2DUU.. function: FromToHeuristic is undefined");
  __cxa_throw(this_00,&SBPL_Exception::typeinfo,std::runtime_error::~runtime_error);
}

Assistant:

int EnvironmentNAV2DUU::GetFromToHeuristic(int FromStateID, int ToStateID)
{
#if USE_HEUR==0
    return 0;
#endif

    //define this function if it is used in the planner

    throw SBPL_Exception("ERROR in EnvNAV2DUU.. function: FromToHeuristic is undefined");

    return 0;
}